

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_sse2.c
# Opt level: O2

void HFilter8_SSE2(uint8_t *u,uint8_t *v,int stride,int thresh,int ithresh,int hev_thresh)

{
  byte bVar1;
  byte bVar2;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  byte bVar17;
  undefined1 auVar3 [16];
  byte bVar18;
  byte bVar19;
  byte bVar21;
  byte bVar22;
  byte bVar23;
  byte bVar24;
  byte bVar25;
  byte bVar26;
  byte bVar27;
  byte bVar28;
  byte bVar29;
  byte bVar30;
  byte bVar31;
  byte bVar32;
  byte bVar33;
  byte bVar34;
  undefined1 auVar20 [16];
  byte bVar35;
  undefined1 auVar36 [16];
  __m128i p0;
  __m128i p3;
  __m128i q3;
  __m128i q2;
  __m128i p1;
  __m128i p2;
  __m128i q1;
  __m128i q0;
  __m128i local_e8;
  __m128i local_d8;
  undefined1 local_c8 [16];
  byte local_b8;
  byte bStack_b7;
  byte bStack_b6;
  byte bStack_b5;
  byte bStack_b4;
  byte bStack_b3;
  byte bStack_b2;
  byte bStack_b1;
  byte bStack_b0;
  byte bStack_af;
  byte bStack_ae;
  byte bStack_ad;
  byte bStack_ac;
  byte bStack_ab;
  byte bStack_aa;
  byte bStack_a9;
  __m128i local_a8;
  __m128i local_98;
  __m128i local_88;
  __m128i local_78;
  __m128i local_68;
  __m128i local_58;
  byte local_48;
  byte bStack_47;
  byte bStack_46;
  byte bStack_45;
  byte bStack_44;
  byte bStack_43;
  byte bStack_42;
  byte bStack_41;
  byte bStack_40;
  byte bStack_3f;
  byte bStack_3e;
  byte bStack_3d;
  byte bStack_3c;
  byte bStack_3b;
  byte bStack_3a;
  byte bStack_39;
  
  Load16x4_SSE2(u + -4,v + -4,stride,&local_d8,&local_78,&local_88,&local_e8);
  auVar20 = psubusb((undefined1  [16])local_88,(undefined1  [16])local_e8);
  auVar3 = psubusb((undefined1  [16])local_e8,(undefined1  [16])local_88);
  auVar3 = auVar3 | auVar20;
  auVar20 = psubusb((undefined1  [16])local_78,(undefined1  [16])local_d8);
  auVar36 = psubusb((undefined1  [16])local_d8,(undefined1  [16])local_78);
  auVar36 = auVar36 | auVar20;
  bVar1 = auVar3[0];
  bVar2 = auVar36[0];
  local_b8 = (bVar2 < bVar1) * bVar1 | (bVar2 >= bVar1) * bVar2;
  bVar1 = auVar3[1];
  bVar2 = auVar36[1];
  bStack_b7 = (bVar2 < bVar1) * bVar1 | (bVar2 >= bVar1) * bVar2;
  bVar1 = auVar3[2];
  bVar2 = auVar36[2];
  bStack_b6 = (bVar2 < bVar1) * bVar1 | (bVar2 >= bVar1) * bVar2;
  bVar1 = auVar3[3];
  bVar2 = auVar36[3];
  bStack_b5 = (bVar2 < bVar1) * bVar1 | (bVar2 >= bVar1) * bVar2;
  bVar1 = auVar3[4];
  bVar2 = auVar36[4];
  bStack_b4 = (bVar2 < bVar1) * bVar1 | (bVar2 >= bVar1) * bVar2;
  bVar1 = auVar3[5];
  bVar2 = auVar36[5];
  bStack_b3 = (bVar2 < bVar1) * bVar1 | (bVar2 >= bVar1) * bVar2;
  bVar1 = auVar3[6];
  bVar2 = auVar36[6];
  bStack_b2 = (bVar2 < bVar1) * bVar1 | (bVar2 >= bVar1) * bVar2;
  bVar1 = auVar3[7];
  bVar2 = auVar36[7];
  bStack_b1 = (bVar2 < bVar1) * bVar1 | (bVar2 >= bVar1) * bVar2;
  bVar1 = auVar3[8];
  bVar2 = auVar36[8];
  bStack_b0 = (bVar2 < bVar1) * bVar1 | (bVar2 >= bVar1) * bVar2;
  bVar1 = auVar3[9];
  bVar2 = auVar36[9];
  bStack_af = (bVar2 < bVar1) * bVar1 | (bVar2 >= bVar1) * bVar2;
  bVar1 = auVar3[10];
  bVar2 = auVar36[10];
  bStack_ae = (bVar2 < bVar1) * bVar1 | (bVar2 >= bVar1) * bVar2;
  bVar1 = auVar3[0xb];
  bVar2 = auVar36[0xb];
  bStack_ad = (bVar2 < bVar1) * bVar1 | (bVar2 >= bVar1) * bVar2;
  bVar1 = auVar3[0xc];
  bVar2 = auVar36[0xc];
  bStack_ac = (bVar2 < bVar1) * bVar1 | (bVar2 >= bVar1) * bVar2;
  bVar1 = auVar3[0xd];
  bVar2 = auVar36[0xd];
  bStack_ab = (bVar2 < bVar1) * bVar1 | (bVar2 >= bVar1) * bVar2;
  bVar1 = auVar3[0xe];
  bVar2 = auVar36[0xe];
  bVar4 = auVar36[0xf];
  bStack_aa = (bVar2 < bVar1) * bVar1 | (bVar2 >= bVar1) * bVar2;
  bVar1 = auVar3[0xf];
  bStack_a9 = (bVar4 < bVar1) * bVar1 | (bVar4 >= bVar1) * bVar4;
  auVar3 = psubusb((undefined1  [16])local_88,(undefined1  [16])local_78);
  local_c8 = psubusb((undefined1  [16])local_78,(undefined1  [16])local_88);
  local_c8 = local_c8 | auVar3;
  Load16x4_SSE2(u,v,stride,&local_58,&local_68,&local_98,&local_a8);
  auVar20 = psubusb((undefined1  [16])local_68,(undefined1  [16])local_58);
  auVar3 = psubusb((undefined1  [16])local_58,(undefined1  [16])local_68);
  auVar3 = auVar3 | auVar20;
  bVar1 = auVar3[0];
  bVar1 = (bVar1 < local_c8[0]) * local_c8[0] | (bVar1 >= local_c8[0]) * bVar1;
  bVar2 = auVar3[1];
  bVar4 = (bVar2 < local_c8[1]) * local_c8[1] | (bVar2 >= local_c8[1]) * bVar2;
  bVar2 = auVar3[2];
  bVar5 = (bVar2 < local_c8[2]) * local_c8[2] | (bVar2 >= local_c8[2]) * bVar2;
  bVar2 = auVar3[3];
  bVar6 = (bVar2 < local_c8[3]) * local_c8[3] | (bVar2 >= local_c8[3]) * bVar2;
  bVar2 = auVar3[4];
  bVar7 = (bVar2 < local_c8[4]) * local_c8[4] | (bVar2 >= local_c8[4]) * bVar2;
  bVar2 = auVar3[5];
  bVar8 = (bVar2 < local_c8[5]) * local_c8[5] | (bVar2 >= local_c8[5]) * bVar2;
  bVar2 = auVar3[6];
  bVar9 = (bVar2 < local_c8[6]) * local_c8[6] | (bVar2 >= local_c8[6]) * bVar2;
  bVar2 = auVar3[7];
  bVar10 = (bVar2 < local_c8[7]) * local_c8[7] | (bVar2 >= local_c8[7]) * bVar2;
  bVar2 = auVar3[8];
  bVar11 = (bVar2 < local_c8[8]) * local_c8[8] | (bVar2 >= local_c8[8]) * bVar2;
  bVar2 = auVar3[9];
  bVar12 = (bVar2 < local_c8[9]) * local_c8[9] | (bVar2 >= local_c8[9]) * bVar2;
  bVar2 = auVar3[10];
  bVar13 = (bVar2 < local_c8[10]) * local_c8[10] | (bVar2 >= local_c8[10]) * bVar2;
  bVar2 = auVar3[0xb];
  bVar14 = (bVar2 < local_c8[0xb]) * local_c8[0xb] | (bVar2 >= local_c8[0xb]) * bVar2;
  bVar2 = auVar3[0xc];
  bVar15 = (bVar2 < local_c8[0xc]) * local_c8[0xc] | (bVar2 >= local_c8[0xc]) * bVar2;
  bVar2 = auVar3[0xd];
  bVar16 = (bVar2 < local_c8[0xd]) * local_c8[0xd] | (bVar2 >= local_c8[0xd]) * bVar2;
  bVar2 = auVar3[0xe];
  bVar18 = auVar3[0xf];
  bVar17 = (bVar2 < local_c8[0xe]) * local_c8[0xe] | (bVar2 >= local_c8[0xe]) * bVar2;
  bVar18 = (bVar18 < local_c8[0xf]) * local_c8[0xf] | (bVar18 >= local_c8[0xf]) * bVar18;
  bVar2 = (bVar1 < local_b8) * local_b8 | (bVar1 >= local_b8) * bVar1;
  bVar4 = (bVar4 < bStack_b7) * bStack_b7 | (bVar4 >= bStack_b7) * bVar4;
  bVar5 = (bVar5 < bStack_b6) * bStack_b6 | (bVar5 >= bStack_b6) * bVar5;
  bVar6 = (bVar6 < bStack_b5) * bStack_b5 | (bVar6 >= bStack_b5) * bVar6;
  bVar7 = (bVar7 < bStack_b4) * bStack_b4 | (bVar7 >= bStack_b4) * bVar7;
  bVar8 = (bVar8 < bStack_b3) * bStack_b3 | (bVar8 >= bStack_b3) * bVar8;
  bVar9 = (bVar9 < bStack_b2) * bStack_b2 | (bVar9 >= bStack_b2) * bVar9;
  bVar10 = (bVar10 < bStack_b1) * bStack_b1 | (bVar10 >= bStack_b1) * bVar10;
  bVar11 = (bVar11 < bStack_b0) * bStack_b0 | (bVar11 >= bStack_b0) * bVar11;
  bVar12 = (bVar12 < bStack_af) * bStack_af | (bVar12 >= bStack_af) * bVar12;
  bVar13 = (bVar13 < bStack_ae) * bStack_ae | (bVar13 >= bStack_ae) * bVar13;
  bVar14 = (bVar14 < bStack_ad) * bStack_ad | (bVar14 >= bStack_ad) * bVar14;
  bVar15 = (bVar15 < bStack_ac) * bStack_ac | (bVar15 >= bStack_ac) * bVar15;
  bVar16 = (bVar16 < bStack_ab) * bStack_ab | (bVar16 >= bStack_ab) * bVar16;
  bVar17 = (bVar17 < bStack_aa) * bStack_aa | (bVar17 >= bStack_aa) * bVar17;
  bVar18 = (bVar18 < bStack_a9) * bStack_a9 | (bVar18 >= bStack_a9) * bVar18;
  auVar3 = psubusb((undefined1  [16])local_98,(undefined1  [16])local_a8);
  auVar20 = psubusb((undefined1  [16])local_a8,(undefined1  [16])local_98);
  auVar20 = auVar20 | auVar3;
  auVar36 = psubusb((undefined1  [16])local_68,(undefined1  [16])local_98);
  auVar3 = psubusb((undefined1  [16])local_98,(undefined1  [16])local_68);
  auVar3 = auVar3 | auVar36;
  bVar1 = auVar20[0];
  bVar19 = auVar3[0];
  bVar19 = (bVar19 < bVar1) * bVar1 | (bVar19 >= bVar1) * bVar19;
  bVar1 = auVar20[1];
  bVar21 = auVar3[1];
  bVar21 = (bVar21 < bVar1) * bVar1 | (bVar21 >= bVar1) * bVar21;
  bVar1 = auVar20[2];
  bVar22 = auVar3[2];
  bVar22 = (bVar22 < bVar1) * bVar1 | (bVar22 >= bVar1) * bVar22;
  bVar1 = auVar20[3];
  bVar23 = auVar3[3];
  bVar23 = (bVar23 < bVar1) * bVar1 | (bVar23 >= bVar1) * bVar23;
  bVar1 = auVar20[4];
  bVar24 = auVar3[4];
  bVar24 = (bVar24 < bVar1) * bVar1 | (bVar24 >= bVar1) * bVar24;
  bVar1 = auVar20[5];
  bVar25 = auVar3[5];
  bVar25 = (bVar25 < bVar1) * bVar1 | (bVar25 >= bVar1) * bVar25;
  bVar1 = auVar20[6];
  bVar26 = auVar3[6];
  bVar26 = (bVar26 < bVar1) * bVar1 | (bVar26 >= bVar1) * bVar26;
  bVar1 = auVar20[7];
  bVar27 = auVar3[7];
  bVar27 = (bVar27 < bVar1) * bVar1 | (bVar27 >= bVar1) * bVar27;
  bVar1 = auVar20[8];
  bVar28 = auVar3[8];
  bVar28 = (bVar28 < bVar1) * bVar1 | (bVar28 >= bVar1) * bVar28;
  bVar1 = auVar20[9];
  bVar29 = auVar3[9];
  bVar29 = (bVar29 < bVar1) * bVar1 | (bVar29 >= bVar1) * bVar29;
  bVar1 = auVar20[10];
  bVar30 = auVar3[10];
  bVar30 = (bVar30 < bVar1) * bVar1 | (bVar30 >= bVar1) * bVar30;
  bVar1 = auVar20[0xb];
  bVar31 = auVar3[0xb];
  bVar31 = (bVar31 < bVar1) * bVar1 | (bVar31 >= bVar1) * bVar31;
  bVar1 = auVar20[0xc];
  bVar32 = auVar3[0xc];
  bVar32 = (bVar32 < bVar1) * bVar1 | (bVar32 >= bVar1) * bVar32;
  bVar1 = auVar20[0xd];
  bVar33 = auVar3[0xd];
  bVar33 = (bVar33 < bVar1) * bVar1 | (bVar33 >= bVar1) * bVar33;
  bVar1 = auVar20[0xe];
  bVar34 = auVar3[0xe];
  bVar35 = auVar3[0xf];
  bVar34 = (bVar34 < bVar1) * bVar1 | (bVar34 >= bVar1) * bVar34;
  bVar1 = auVar20[0xf];
  bVar1 = (bVar35 < bVar1) * bVar1 | (bVar35 >= bVar1) * bVar35;
  local_48 = (bVar19 < bVar2) * bVar2 | (bVar19 >= bVar2) * bVar19;
  bStack_47 = (bVar21 < bVar4) * bVar4 | (bVar21 >= bVar4) * bVar21;
  bStack_46 = (bVar22 < bVar5) * bVar5 | (bVar22 >= bVar5) * bVar22;
  bStack_45 = (bVar23 < bVar6) * bVar6 | (bVar23 >= bVar6) * bVar23;
  bStack_44 = (bVar24 < bVar7) * bVar7 | (bVar24 >= bVar7) * bVar24;
  bStack_43 = (bVar25 < bVar8) * bVar8 | (bVar25 >= bVar8) * bVar25;
  bStack_42 = (bVar26 < bVar9) * bVar9 | (bVar26 >= bVar9) * bVar26;
  bStack_41 = (bVar27 < bVar10) * bVar10 | (bVar27 >= bVar10) * bVar27;
  bStack_40 = (bVar28 < bVar11) * bVar11 | (bVar28 >= bVar11) * bVar28;
  bStack_3f = (bVar29 < bVar12) * bVar12 | (bVar29 >= bVar12) * bVar29;
  bStack_3e = (bVar30 < bVar13) * bVar13 | (bVar30 >= bVar13) * bVar30;
  bStack_3d = (bVar31 < bVar14) * bVar14 | (bVar31 >= bVar14) * bVar31;
  bStack_3c = (bVar32 < bVar15) * bVar15 | (bVar32 >= bVar15) * bVar32;
  bStack_3b = (bVar33 < bVar16) * bVar16 | (bVar33 >= bVar16) * bVar33;
  bStack_3a = (bVar34 < bVar17) * bVar17 | (bVar34 >= bVar17) * bVar34;
  bStack_39 = (bVar1 < bVar18) * bVar18 | (bVar1 >= bVar18) * bVar1;
  ComplexMask_SSE2(&local_88,&local_e8,&local_58,&local_68,thresh,ithresh,(__m128i *)&local_48);
  DoFilter6_SSE2(&local_78,&local_88,&local_e8,&local_58,&local_68,&local_98,(__m128i *)&local_48,
                 hev_thresh);
  Store16x4_SSE2(&local_d8,&local_78,&local_88,&local_e8,u + -4,v + -4,stride);
  Store16x4_SSE2(&local_58,&local_68,&local_98,&local_a8,u,v,stride);
  return;
}

Assistant:

static void HFilter8_SSE2(uint8_t* WEBP_RESTRICT u, uint8_t* WEBP_RESTRICT v,
                          int stride, int thresh, int ithresh, int hev_thresh) {
  __m128i mask;
  __m128i p3, p2, p1, p0, q0, q1, q2, q3;

  uint8_t* const tu = u - 4;
  uint8_t* const tv = v - 4;
  Load16x4_SSE2(tu, tv, stride, &p3, &p2, &p1, &p0);
  MAX_DIFF1(p3, p2, p1, p0, mask);

  Load16x4_SSE2(u, v, stride, &q0, &q1, &q2, &q3);
  MAX_DIFF2(q3, q2, q1, q0, mask);

  ComplexMask_SSE2(&p1, &p0, &q0, &q1, thresh, ithresh, &mask);
  DoFilter6_SSE2(&p2, &p1, &p0, &q0, &q1, &q2, &mask, hev_thresh);

  Store16x4_SSE2(&p3, &p2, &p1, &p0, tu, tv, stride);
  Store16x4_SSE2(&q0, &q1, &q2, &q3, u, v, stride);
}